

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O2

int pkey_ec_sign(EVP_PKEY_CTX *ctx,uint8_t *sig,size_t *siglen,uint8_t *tbs,size_t tbslen)

{
  EC_KEY *eckey;
  int iVar1;
  undefined8 in_RAX;
  undefined4 extraout_var;
  ulong uVar2;
  uint sltmp;
  undefined4 extraout_var_00;
  
  sltmp = (uint)((ulong)in_RAX >> 0x20);
  eckey = (EC_KEY *)ctx->pkey->pkey;
  if (sig == (uint8_t *)0x0) {
    iVar1 = ECDSA_size(eckey);
    uVar2 = CONCAT44(extraout_var_00,iVar1);
  }
  else {
    uVar2 = *siglen;
    iVar1 = ECDSA_size(eckey);
    if (uVar2 < CONCAT44(extraout_var,iVar1)) {
      ERR_put_error(6,0,100,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                    ,0x50);
      return 0;
    }
    iVar1 = ECDSA_sign(0,tbs,(int)tbslen,sig,&sltmp,eckey);
    if (iVar1 == 0) {
      return 0;
    }
    uVar2 = (ulong)sltmp;
  }
  *siglen = uVar2;
  return 1;
}

Assistant:

static int pkey_ec_sign(EVP_PKEY_CTX *ctx, uint8_t *sig, size_t *siglen,
                        const uint8_t *tbs, size_t tbslen) {
  const EC_KEY *ec = reinterpret_cast<EC_KEY *>(ctx->pkey->pkey);
  if (!sig) {
    *siglen = ECDSA_size(ec);
    return 1;
  } else if (*siglen < (size_t)ECDSA_size(ec)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_BUFFER_TOO_SMALL);
    return 0;
  }

  unsigned int sltmp;
  if (!ECDSA_sign(0, tbs, tbslen, sig, &sltmp, ec)) {
    return 0;
  }
  *siglen = (size_t)sltmp;
  return 1;
}